

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Obj_t * Abc_NodeFindCoFanout(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pNode_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Abc_ObjFanoutNum(pNode);
    if (iVar1 <= local_24) {
      return (Abc_Obj_t *)0x0;
    }
    pObj = Abc_ObjFanout(pNode,local_24);
    iVar1 = Abc_ObjIsCo(pObj);
    if (iVar1 != 0) break;
    local_24 = local_24 + 1;
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NodeFindCoFanout( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pNode, pFanout, i )
        if ( Abc_ObjIsCo(pFanout) )
            return pFanout;
    return NULL;
}